

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
zmq::object_t::send_pipe_peer_stats
          (object_t *this,pipe_t *destination_,uint64_t queue_count_,own_t *socket_base_,
          endpoint_uri_pair_t *endpoint_pair_)

{
  command_t cmd;
  command_t local_c0 [2];
  
  local_c0[0].type = pipe_peer_stats;
  local_c0[0].destination = &destination_->super_object_t;
  local_c0[0].args._0_8_ = queue_count_;
  local_c0[0].args._8_8_ = socket_base_;
  local_c0[0].args._16_8_ = endpoint_pair_;
  send_command(this,local_c0);
  return;
}

Assistant:

void zmq::object_t::send_pipe_peer_stats (pipe_t *destination_,
                                          uint64_t queue_count_,
                                          own_t *socket_base_,
                                          endpoint_uri_pair_t *endpoint_pair_)
{
    command_t cmd;
    cmd.destination = destination_;
    cmd.type = command_t::pipe_peer_stats;
    cmd.args.pipe_peer_stats.queue_count = queue_count_;
    cmd.args.pipe_peer_stats.socket_base = socket_base_;
    cmd.args.pipe_peer_stats.endpoint_pair = endpoint_pair_;
    send_command (cmd);
}